

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O1

int lua_rawequal(lua_State *L,int idx1,int idx2)

{
  uint uVar1;
  TValue *pTVar2;
  TValue *pTVar3;
  TValue *pTVar4;
  bool bVar5;
  
  pTVar2 = index2adr(L,idx1);
  pTVar3 = index2adr(L,idx2);
  pTVar4 = (TValue *)((ulong)(L->glref).ptr32 + 0x68);
  if (pTVar3 == pTVar4 || pTVar2 == pTVar4) {
    return 0;
  }
  uVar1 = (pTVar2->field_2).it;
  if (uVar1 == (pTVar3->field_2).it) {
    bVar5 = true;
    if (0xfffffffc < uVar1) goto LAB_0010f980;
    if (0xfffefffe < uVar1) {
      bVar5 = (pTVar2->u32).lo == (pTVar3->u32).lo;
      goto LAB_0010f980;
    }
  }
  else if (0xfffeffff < (pTVar3->field_2).it || 0xfffeffff < uVar1) {
    bVar5 = false;
    goto LAB_0010f980;
  }
  bVar5 = (bool)(-(pTVar3->n == pTVar2->n) & 1);
LAB_0010f980:
  return (uint)bVar5;
}

Assistant:

LUA_API int lua_rawequal(lua_State *L, int idx1, int idx2)
{
  cTValue *o1 = index2adr(L, idx1);
  cTValue *o2 = index2adr(L, idx2);
  return (o1 == niltv(L) || o2 == niltv(L)) ? 0 : lj_obj_equal(o1, o2);
}